

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O3

void __thiscall
QPointingDevicePrivate::sendTouchCancelEvent(QPointingDevicePrivate *this,QTouchEvent *cancelEvent)

{
  QEventPointPrivate *pQVar1;
  QEventPointPrivate *pQVar2;
  long lVar3;
  EventPointData *epd_1;
  QEventPoint *pQVar4;
  EventPointData *epd;
  
  if (((cancelEvent->super_QPointerEvent).m_points.d.size == 0) &&
     (lVar3 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
              super_QVLABaseBase.s, lVar3 != 0)) {
    pQVar4 = (QEventPoint *)
             (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
             super_QVLABaseBase.ptr;
    lVar3 = lVar3 * 0x58;
    do {
      pQVar1 = pQVar4[1].d.d.ptr;
      if (((pQVar1 != (QEventPointPrivate *)0x0) && (*(int *)&pQVar1->field_0x4 != 0)) &&
         (pQVar4[2].d.d.ptr != (QEventPointPrivate *)0x0)) {
        QMutableTouchEvent::addPoint(cancelEvent,pQVar4);
      }
      pQVar4 = pQVar4 + 0xb;
      lVar3 = lVar3 + -0x58;
    } while (lVar3 != 0);
  }
  lVar3 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
          super_QVLABaseBase.s;
  if (lVar3 != 0) {
    pQVar4 = (QEventPoint *)
             (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
             super_QVLABaseBase.ptr;
    lVar3 = lVar3 * 0x58;
    do {
      pQVar1 = pQVar4[1].d.d.ptr;
      if (((pQVar1 != (QEventPointPrivate *)0x0) && (*(int *)&pQVar1->field_0x4 != 0)) &&
         (pQVar2 = pQVar4[2].d.d.ptr, pQVar2 != (QEventPointPrivate *)0x0)) {
        if (*(int *)&pQVar1->field_0x4 == 0) {
          pQVar2 = (QEventPointPrivate *)0x0;
        }
        QCoreApplication::sendEvent((QObject *)pQVar2,(QEvent *)cancelEvent);
      }
      QPointerEvent::setExclusiveGrabber(&cancelEvent->super_QPointerEvent,pQVar4,(QObject *)0x0);
      QPointerEvent::clearPassiveGrabbers(&cancelEvent->super_QPointerEvent,pQVar4);
      pQVar4 = pQVar4 + 0xb;
      lVar3 = lVar3 + -0x58;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void QPointingDevicePrivate::sendTouchCancelEvent(QTouchEvent *cancelEvent)
{
    // An incoming TouchCancel event will typically not contain any points, but
    // QQuickPointerHandler::onGrabChanged needs to be called for each point
    // that has an exclusive grabber. Adding those points to the event makes it
    // an easy iteration there.
    if (cancelEvent->points().isEmpty()) {
        for (auto &epd : activePoints.values()) {
            if (epd.exclusiveGrabber)
                QMutableTouchEvent::addPoint(cancelEvent, epd.eventPoint);
        }
    }
    for (auto &epd : activePoints.values()) {
        if (epd.exclusiveGrabber)
            QCoreApplication::sendEvent(epd.exclusiveGrabber, cancelEvent);
        // The next touch event can only be a TouchBegin, so clean up.
        cancelEvent->setExclusiveGrabber(epd.eventPoint, nullptr);
        cancelEvent->clearPassiveGrabbers(epd.eventPoint);
    }
}